

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

void examine_app14(j_decompress_ptr cinfo,JOCTET *data,uint datalen,JLONG remaining)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  jpeg_error_mgr *pjVar4;
  
  if ((((0xb < datalen) && (*data == 'A')) && (data[1] == 'd')) &&
     (((data[2] == 'o' && (data[3] == 'b')) && (data[4] == 'e')))) {
    uVar2 = *(ushort *)(data + 7);
    uVar3 = *(ushort *)(data + 9);
    bVar1 = data[0xb];
    pjVar4 = cinfo->err;
    *(uint *)&pjVar4->msg_parm =
         (uint)(ushort)(*(ushort *)(data + 5) << 8 | *(ushort *)(data + 5) >> 8);
    *(uint *)((long)&pjVar4->msg_parm + 4) = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    *(uint *)((long)&pjVar4->msg_parm + 8) = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
    *(uint *)((long)&pjVar4->msg_parm + 0xc) = (uint)bVar1;
    pjVar4->msg_code = 0x4c;
    (*pjVar4->emit_message)((j_common_ptr)cinfo,1);
    cinfo->saw_Adobe_marker = 1;
    cinfo->Adobe_transform = bVar1;
    return;
  }
  pjVar4 = cinfo->err;
  pjVar4->msg_code = 0x4e;
  (pjVar4->msg_parm).i[0] = (int)remaining + datalen;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
examine_app14(j_decompress_ptr cinfo, JOCTET *data, unsigned int datalen,
              JLONG remaining)
/* Examine first few bytes from an APP14.
 * Take appropriate action if it is an Adobe marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  unsigned int version, flags0, flags1, transform;

  if (datalen >= APP14_DATA_LEN &&
      data[0] == 0x41 &&
      data[1] == 0x64 &&
      data[2] == 0x6F &&
      data[3] == 0x62 &&
      data[4] == 0x65) {
    /* Found Adobe APP14 marker */
    version = (data[5] << 8) + data[6];
    flags0 = (data[7] << 8) + data[8];
    flags1 = (data[9] << 8) + data[10];
    transform = data[11];
    TRACEMS4(cinfo, 1, JTRC_ADOBE, version, flags0, flags1, transform);
    cinfo->saw_Adobe_marker = TRUE;
    cinfo->Adobe_transform = (UINT8)transform;
  } else {
    /* Start of APP14 does not match "Adobe", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP14, (int)(datalen + remaining));
  }
}